

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v8::to_string<char,500ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v8 *this,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  long lVar1;
  long lVar2;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(this + 0x10);
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::__cxx11::string::~string((string *)&local_38);
  lVar2 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

auto to_string(const basic_memory_buffer<Char, SIZE>& buf)
    -> std::basic_string<Char> {
  auto size = buf.size();
  detail::assume(size < std::basic_string<Char>().max_size());
  return std::basic_string<Char>(buf.data(), size);
}